

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O1

void dbgaddhist(dbgcxdef *ctx,char *buf,int l)

{
  char *__dest;
  long lVar1;
  ulong uVar2;
  
  if (ctx->dbgcxhstl <= l + ctx->dbgcxhstf + 1) {
    __dest = ctx->dbgcxhstp;
    uVar2 = 0;
    if (*__dest != '\0' || 0 < l) {
      uVar2 = 0;
      do {
        lVar1 = uVar2 + 1;
        uVar2 = uVar2 + 1;
      } while ((int)uVar2 < l || __dest[lVar1] != '\0');
    }
    memmove(__dest,__dest + (uVar2 & 0xffffffff),(ulong)(ctx->dbgcxhstf - (int)uVar2));
    ctx->dbgcxhstf = ctx->dbgcxhstf - (int)uVar2;
  }
  memcpy(ctx->dbgcxhstp + ctx->dbgcxhstf,buf,(long)l);
  ctx->dbgcxhstf = ctx->dbgcxhstf + l;
  return;
}

Assistant:

void dbgaddhist(dbgcxdef *ctx, char *buf, int l)
{
    char *p;
    int   dell;

    if (ctx->dbgcxhstf + l + 1 >= ctx->dbgcxhstl)
    {
        /* delete first lines until we have enough space */
        for (dell = 0, p = ctx->dbgcxhstp ; *p || dell < l ; ++p, ++dell) ;
        if (*p) ++p;
        memmove(ctx->dbgcxhstp, ctx->dbgcxhstp + dell,
                (size_t)(ctx->dbgcxhstf - dell));
        ctx->dbgcxhstf -= dell;
    }
    memcpy(ctx->dbgcxhstp + ctx->dbgcxhstf, buf, (size_t)l);
    ctx->dbgcxhstf += l;
}